

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void __thiscall Catch::TestCaseTracking::SectionTracker::tryOpen(SectionTracker *this)

{
  int iVar1;
  int __oflag;
  char *in_RSI;
  
  iVar1 = (*(this->super_TrackerBase).super_ITracker._vptr_ITracker[2])();
  if ((char)iVar1 != '\0') {
    return;
  }
  TrackerBase::open(&this->super_TrackerBase,in_RSI,__oflag);
  return;
}

Assistant:

void SectionTracker::tryOpen() {
        if( !isComplete() )
            open();
    }